

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  int local_1c;
  int local_18;
  int n;
  int i_1;
  int i;
  ImFontAtlas *this_local;
  
  if ((this->Locked & 1U) != 0) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x611,"void ImFontAtlas::ClearInputData()");
  }
  for (n = 0; n < (this->ConfigData).Size; n = n + 1) {
    pIVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,n);
    if ((pIVar1->FontData != (void *)0x0) &&
       (pIVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,n),
       (pIVar1->FontDataOwnedByAtlas & 1U) != 0)) {
      pIVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,n);
      ImGui::MemFree(pIVar1->FontData);
      pIVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,n);
      pIVar1->FontData = (void *)0x0;
    }
  }
  for (local_18 = 0; local_18 < (this->Fonts).Size; local_18 = local_18 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
    if (((this->ConfigData).Data <= (*ppIVar2)->ConfigData) &&
       (ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18),
       (*ppIVar2)->ConfigData < (this->ConfigData).Data + (this->ConfigData).Size)) {
      ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
      (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
      ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
      (*ppIVar2)->ConfigDataCount = 0;
    }
  }
  ImVector<ImFontConfig>::clear(&this->ConfigData);
  ImVector<ImFontAtlasCustomRect>::clear(&this->CustomRects);
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    this->CustomRectIds[local_1c] = -1;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}